

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_gDay(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  Status SVar3;
  XMLCh *pXVar4;
  char *pcVar5;
  XSValue *pXVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  undefined1 *__src;
  void *pvVar10;
  bool bVar11;
  StrX local_5c8;
  StrX local_5b8;
  StrX local_5a8;
  long local_598;
  XMLCh *actRetCanRep_5;
  undefined1 local_588 [4];
  Status myStatus_17;
  StrX local_578;
  StrX local_568;
  long local_558;
  XMLCh *actRetCanRep_4;
  undefined1 local_548 [4];
  Status myStatus_16;
  StrX local_538;
  StrX local_528;
  long local_518;
  XMLCh *actRetCanRep_3;
  undefined1 local_508 [4];
  Status myStatus_15;
  StrX local_4f8;
  StrX local_4e8;
  long local_4d8;
  XMLCh *actRetCanRep_2;
  undefined1 local_4c8 [4];
  Status myStatus_14;
  StrX local_4b8;
  StrX local_4a8;
  long local_498;
  XMLCh *actRetCanRep_1;
  undefined1 local_488 [4];
  Status myStatus_13;
  StrX local_478;
  StrX local_468;
  long local_458;
  XMLCh *actRetCanRep;
  Status myStatus_12;
  int j;
  StrX local_438;
  StrX local_428;
  XSValue *local_418;
  XSValue *actRetValue_5;
  undefined1 local_408 [4];
  Status myStatus_11;
  StrX local_3f8;
  StrX local_3e8;
  XSValue *local_3d8;
  XSValue *actRetValue_4;
  undefined1 local_3c8 [4];
  Status myStatus_10;
  StrX local_3b8;
  StrX local_3a8;
  XSValue *local_398;
  XSValue *actRetValue_3;
  undefined1 local_388 [4];
  Status myStatus_9;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  StrX local_328;
  XSValue *local_318;
  XSValue *actRetValue_2;
  undefined1 local_308 [4];
  Status myStatus_8;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  StrX local_2a8;
  XSValue *local_298;
  XSValue *actRetValue_1;
  undefined1 local_288 [4];
  Status myStatus_7;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  StrX local_228;
  XSValue *local_218;
  XSValue *actRetValue;
  Status myStatus_6;
  int i;
  StrX local_1f8;
  StrX local_1e8;
  byte local_1d5;
  Status local_1d4;
  undefined1 local_1d0 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_1c0;
  StrX local_1b0;
  byte local_19d;
  Status local_19c;
  undefined1 local_198 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_188;
  StrX local_178;
  byte local_165;
  Status local_164;
  undefined1 local_160 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_150;
  byte local_13d;
  Status local_13c;
  undefined1 local_138 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_128;
  byte local_115;
  Status local_114;
  undefined1 local_110 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_f0;
  byte local_dd;
  Status local_dc;
  undefined1 local_d8 [3];
  bool actRetValid;
  Status myStatus;
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  char iv_3 [5];
  char iv_2 [9];
  char iv_1 [7];
  char v_3 [6];
  char v_2 [12];
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char v_1 [19];
  bool toValidate;
  DataType dt;
  
  builtin_strncpy(v_2 + 8,"   -",4);
  cStack_24 = '-';
  cStack_23 = '-';
  cStack_22 = '3';
  cStack_21 = '1';
  _v_3 = 0x31302d31302d2d2d;
  builtin_strncpy(v_2,":30",4);
  builtin_strncpy(iv_1,"---28",6);
  stack0xffffffffffffffb8 = 0x2b2d2d2d;
  _iv_3 = 0x30302e38322d2d2d;
  iv_2[0] = '\0';
  act_v_ran_v_1.fValue._28_1_ = 0;
  act_v_ran_v_1.fValue._24_4_ = 0x31332d2d;
  act_v_ran_v_1.f_datatype = dt_string;
  act_v_ran_v_1._4_4_ = 0;
  act_v_ran_v_1.fValue.f_int = 0x1e;
  act_v_ran_v_1.fValue.f_datetime.f_month = 0;
  act_v_ran_v_1.fValue.f_datetime.f_day = 0;
  act_v_ran_v_1.fValue.f_datetime.f_hour = 0;
  act_v_ran_v_1.fValue._16_8_ = 0;
  act_v_ran_v_2.f_datatype = dt_string;
  act_v_ran_v_2._4_4_ = 0;
  act_v_ran_v_2.fValue.f_int = 1;
  act_v_ran_v_2.fValue.f_datetime.f_month = 0;
  act_v_ran_v_2.fValue.f_datetime.f_day = 0;
  act_v_ran_v_2.fValue.f_datetime.f_hour = 0;
  act_v_ran_v_2.fValue._16_8_ = 0;
  act_v_ran_v_3.f_datatype = dt_string;
  act_v_ran_v_3._4_4_ = 0;
  act_v_ran_v_3.fValue.f_int = 0x1c;
  act_v_ran_v_3.fValue.f_datetime.f_month = 0;
  act_v_ran_v_3.fValue.f_datetime.f_day = 0;
  act_v_ran_v_3.fValue.f_datetime.f_hour = 0;
  act_v_ran_v_3.fValue._16_8_ = 0;
  local_dc = st_Init;
  StrX::StrX(&local_f0,v_2 + 8);
  pXVar4 = StrX::unicodeForm(&local_f0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gDay,&local_dc,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  StrX::~StrX(&local_f0);
  local_dd = bVar1 & 1;
  if (local_dd != 1) {
    pXVar4 = getDataTypeString(dt_gDay);
    StrX::StrX((StrX *)local_110,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_110);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10fa,v_2 + 8,pcVar5,1);
    StrX::~StrX((StrX *)local_110);
    errSeen = true;
  }
  local_114 = st_Init;
  StrX::StrX(&local_128,v_3);
  pXVar4 = StrX::unicodeForm(&local_128);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gDay,&local_114,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_128);
  local_115 = bVar1 & 1;
  if (local_115 != 1) {
    pXVar4 = getDataTypeString(dt_gDay);
    StrX::StrX((StrX *)local_138,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_138);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10fb,v_3,pcVar5,1);
    StrX::~StrX((StrX *)local_138);
    errSeen = true;
  }
  local_13c = st_Init;
  StrX::StrX(&local_150,iv_1);
  pXVar4 = StrX::unicodeForm(&local_150);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gDay,&local_13c,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_150);
  local_13d = bVar1 & 1;
  if (local_13d != 1) {
    pXVar4 = getDataTypeString(dt_gDay);
    StrX::StrX((StrX *)local_160,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_160);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10fc,iv_1,pcVar5,1);
    StrX::~StrX((StrX *)local_160);
    errSeen = true;
  }
  local_164 = st_Init;
  StrX::StrX(&local_178,iv_2 + 8);
  pXVar4 = StrX::unicodeForm(&local_178);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gDay,&local_164,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_178);
  local_165 = bVar1 & 1;
  if (local_165 == 0) {
    if (local_164 != st_FOCA0002) {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX((StrX *)local_198,pXVar4);
      pcVar5 = StrX::localForm((StrX *)local_198);
      pcVar7 = getStatusString(st_FOCA0002);
      pcVar8 = getStatusString(local_164);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x10ff,iv_2 + 8,pcVar5,pcVar7,pcVar8);
      StrX::~StrX((StrX *)local_198);
      errSeen = true;
    }
  }
  else {
    pXVar4 = getDataTypeString(dt_gDay);
    StrX::StrX(&local_188,pXVar4);
    pcVar5 = StrX::localForm(&local_188);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10ff,iv_2 + 8,pcVar5,0);
    StrX::~StrX(&local_188);
    errSeen = true;
  }
  local_19c = st_Init;
  StrX::StrX(&local_1b0,iv_3);
  pXVar4 = StrX::unicodeForm(&local_1b0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gDay,&local_19c,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_1b0);
  local_19d = bVar1 & 1;
  if (local_19d == 0) {
    if (local_19c != st_FOCA0002) {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX((StrX *)local_1d0,pXVar4);
      pcVar5 = StrX::localForm((StrX *)local_1d0);
      pcVar7 = getStatusString(st_FOCA0002);
      pcVar8 = getStatusString(local_19c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1100,iv_3,pcVar5,pcVar7,pcVar8);
      StrX::~StrX((StrX *)local_1d0);
      errSeen = true;
    }
  }
  else {
    pXVar4 = getDataTypeString(dt_gDay);
    StrX::StrX(&local_1c0,pXVar4);
    pcVar5 = StrX::localForm(&local_1c0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1100,iv_3,pcVar5,0);
    StrX::~StrX(&local_1c0);
    errSeen = true;
  }
  local_1d4 = st_Init;
  StrX::StrX(&local_1e8,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar4 = StrX::unicodeForm(&local_1e8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gDay,&local_1d4,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_1e8);
  local_1d5 = bVar1 & 1;
  if (local_1d5 == 0) {
    if (local_1d4 != st_FOCA0002) {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX((StrX *)&myStatus_6,pXVar4);
      pcVar5 = StrX::localForm((StrX *)&myStatus_6);
      pcVar7 = getStatusString(st_FOCA0002);
      pcVar8 = getStatusString(local_1d4);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1101,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
      StrX::~StrX((StrX *)&myStatus_6);
      errSeen = true;
    }
  }
  else {
    pXVar4 = getDataTypeString(dt_gDay);
    StrX::StrX(&local_1f8,pXVar4);
    pcVar5 = StrX::localForm(&local_1f8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1101,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,0);
    StrX::~StrX(&local_1f8);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_228,v_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_228);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gDay,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    local_218 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX((StrX *)local_288,pXVar4);
      StrX::localForm((StrX *)local_288);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x111b,v_2 + 8);
      StrX::~StrX((StrX *)local_288);
      errSeen = true;
    }
    else {
      memcpy(&local_250,pXVar6,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_278,pvVar10,0x28);
      actValue.fValue.f_long = uStack_248;
      actValue._0_8_ = local_250;
      actValue.fValue._8_8_ = local_240;
      actValue.fValue._16_8_ = uStack_238;
      actValue.fValue.f_datetime.f_milisec = (double)local_230;
      expValue.fValue.f_long = uStack_270;
      expValue._0_8_ = local_278;
      expValue.fValue._8_8_ = local_268;
      expValue.fValue._16_8_ = uStack_260;
      expValue.fValue.f_datetime.f_milisec = (double)local_258;
      bVar2 = compareActualValue(dt_gDay,actValue,expValue);
      pXVar6 = local_218;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_218 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_218);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_2a8,v_3);
    pXVar4 = StrX::unicodeForm(&local_2a8);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gDay,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2a8);
    local_298 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX((StrX *)local_308,pXVar4);
      StrX::localForm((StrX *)local_308);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x111c,v_3);
      StrX::~StrX((StrX *)local_308);
      errSeen = true;
    }
    else {
      memcpy(&local_2d0,pXVar6,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_3.fValue + 0x18);
      memcpy(&local_2f8,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_2c8;
      actValue_00._0_8_ = local_2d0;
      actValue_00.fValue._8_8_ = local_2c0;
      actValue_00.fValue._16_8_ = uStack_2b8;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_2b0;
      expValue_00.fValue.f_long = uStack_2f0;
      expValue_00._0_8_ = local_2f8;
      expValue_00.fValue._8_8_ = local_2e8;
      expValue_00.fValue._16_8_ = uStack_2e0;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_2d8;
      bVar2 = compareActualValue(dt_gDay,actValue_00,expValue_00);
      pXVar6 = local_298;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_298 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_298);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_328,iv_1);
    pXVar4 = StrX::unicodeForm(&local_328);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gDay,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_328);
    local_318 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX((StrX *)local_388,pXVar4);
      StrX::localForm((StrX *)local_388);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x111d,iv_1);
      StrX::~StrX((StrX *)local_388);
      errSeen = true;
    }
    else {
      memcpy(&local_350,pXVar6,0x28);
      __src = local_d8;
      memcpy(&local_378,__src,0x28);
      actValue_01.fValue.f_long = uStack_348;
      actValue_01._0_8_ = local_350;
      actValue_01.fValue._8_8_ = local_340;
      actValue_01.fValue._16_8_ = uStack_338;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_330;
      expValue_01.fValue.f_long = uStack_370;
      expValue_01._0_8_ = local_378;
      expValue_01.fValue._8_8_ = local_368;
      expValue_01.fValue._16_8_ = uStack_360;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_358;
      bVar2 = compareActualValue(dt_gDay,actValue_01,expValue_01);
      pXVar6 = local_318;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_318 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_318);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,__src);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_3a8,iv_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_3a8);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gDay,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3a8);
    local_398 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar4 = getDataTypeString(dt_gDay);
        StrX::StrX((StrX *)local_3c8,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3c8);
        pcVar7 = getStatusString(st_FOCA0002);
        pcVar8 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1120,iv_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3c8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX(&local_3b8,pXVar4);
      StrX::localForm(&local_3b8);
      pvVar10 = (void *)0x1120;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1120,iv_2 + 8);
      StrX::~StrX(&local_3b8);
      pXVar6 = local_398;
      errSeen = true;
      if (local_398 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_398);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_3e8,iv_3);
    pXVar4 = StrX::unicodeForm(&local_3e8);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gDay,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3e8);
    local_3d8 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar4 = getDataTypeString(dt_gDay);
        StrX::StrX((StrX *)local_408,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_408);
        pcVar7 = getStatusString(st_FOCA0002);
        pcVar8 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1121,iv_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_408);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX(&local_3f8,pXVar4);
      StrX::localForm(&local_3f8);
      pvVar10 = (void *)0x1121;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1121,iv_3);
      StrX::~StrX(&local_3f8);
      pXVar6 = local_3d8;
      errSeen = true;
      if (local_3d8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3d8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_428,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_428);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gDay,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    local_418 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar4 = getDataTypeString(dt_gDay);
        StrX::StrX((StrX *)&myStatus_12,pXVar4);
        pcVar5 = StrX::localForm((StrX *)&myStatus_12);
        pcVar7 = getStatusString(st_FOCA0002);
        pcVar8 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1122,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)&myStatus_12);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX(&local_438,pXVar4);
      StrX::localForm(&local_438);
      pvVar10 = (void *)0x1122;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1122,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_438);
      pXVar6 = local_418;
      errSeen = true;
      if (local_418 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_418);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = st_Init;
    StrX::StrX(&local_468,v_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_468);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gDay,(Status *)&actRetCanRep,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    local_458 = lVar9;
    if (lVar9 == 0) {
      if ((Status)actRetCanRep != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_gDay);
        StrX::StrX((StrX *)local_488,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_488);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString((Status)actRetCanRep);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x113e,v_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_488);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX(&local_478,pXVar4);
      StrX::localForm(&local_478);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x113e,v_2 + 8);
      StrX::~StrX(&local_478);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_458);
      errSeen = true;
    }
    actRetCanRep_1._4_4_ = st_Init;
    StrX::StrX(&local_4a8,v_3);
    pXVar4 = StrX::unicodeForm(&local_4a8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gDay,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4a8);
    local_498 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_1._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_gDay);
        StrX::StrX((StrX *)local_4c8,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_4c8);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_1._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x113f,v_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_4c8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX(&local_4b8,pXVar4);
      StrX::localForm(&local_4b8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x113f,v_3);
      StrX::~StrX(&local_4b8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_498);
      errSeen = true;
    }
    actRetCanRep_2._4_4_ = st_Init;
    StrX::StrX(&local_4e8,iv_1);
    pXVar4 = StrX::unicodeForm(&local_4e8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gDay,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4e8);
    local_4d8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_2._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_gDay);
        StrX::StrX((StrX *)local_508,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_508);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_2._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1140,iv_1,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_508);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX(&local_4f8,pXVar4);
      StrX::localForm(&local_4f8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1140,iv_1);
      StrX::~StrX(&local_4f8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_4d8);
      errSeen = true;
    }
    actRetCanRep_3._4_4_ = st_Init;
    StrX::StrX(&local_528,iv_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_528);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gDay,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_528);
    local_518 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_3._4_4_) {
        pXVar4 = getDataTypeString(dt_gDay);
        StrX::StrX((StrX *)local_548,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_548);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_3._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1144,iv_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_548);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX(&local_538,pXVar4);
      StrX::localForm(&local_538);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1144,iv_2 + 8);
      StrX::~StrX(&local_538);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_518);
      errSeen = true;
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_568,iv_3);
    pXVar4 = StrX::unicodeForm(&local_568);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gDay,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_568);
    local_558 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_4._4_4_) {
        pXVar4 = getDataTypeString(dt_gDay);
        StrX::StrX((StrX *)local_588,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_588);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1146,iv_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_588);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX(&local_578,pXVar4);
      StrX::localForm(&local_578);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1146,iv_3);
      StrX::~StrX(&local_578);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_558);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_5a8,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_5a8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gDay,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_5a8);
    local_598 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_5._4_4_) {
        pXVar4 = getDataTypeString(dt_gDay);
        StrX::StrX(&local_5c8,pXVar4);
        pcVar5 = StrX::localForm(&local_5c8);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1148,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX(&local_5c8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gDay);
      StrX::StrX(&local_5b8,pXVar4);
      StrX::localForm(&local_5b8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1148,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_5b8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_598);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_gDay()
{
    const XSValue::DataType dt = XSValue::dt_gDay;
    bool  toValidate = true;

    const char v_1[]="   ---31+01:30   \n";
    const char v_2[]="---01-01:30";
    const char v_3[]="---28";

    const char iv_1[]="---+31";
    const char iv_2[]="---28.00";
    const char iv_3[]="--31";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    act_v_ran_v_1.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 0;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 0;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 1;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 0;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 28;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_2);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_3);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));

    }

}